

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_metric.hpp
# Opt level: O1

bool __thiscall
ylt::metric::
dynamic_metric_impl<ylt::metric::detail::summary_impl<unsigned_int,_6UL>,_(unsigned_char)'\x02'>::
my_equal::operator()
          (my_equal *this,
          span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          *s1,span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
              *s2)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  pointer pbVar5;
  pointer pbVar6;
  size_type __n;
  bool bVar7;
  bool bVar8;
  
  pbVar1 = s1->_M_ptr;
  pbVar2 = s2->_M_ptr;
  __n = pbVar1->_M_string_length;
  if (__n == pbVar2->_M_string_length) {
    pbVar5 = pbVar2;
    pbVar6 = pbVar1;
    bVar7 = false;
    bVar3 = false;
    do {
      bVar8 = bVar3;
      if (__n == 0) {
        if (bVar8 != false) {
          return bVar8;
        }
      }
      else {
        iVar4 = bcmp((pbVar6->_M_dataplus)._M_p,(pbVar5->_M_dataplus)._M_p,__n);
        if ((bool)(iVar4 != 0 | bVar8)) {
          if (iVar4 == 0) {
            return bVar8;
          }
          return bVar7;
        }
      }
      __n = pbVar1[1]._M_string_length;
      pbVar5 = pbVar2 + 1;
      pbVar6 = pbVar1 + 1;
      bVar7 = bVar8;
      bVar3 = true;
    } while (__n == pbVar2[1]._M_string_length);
  }
  else {
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool operator()(const std::span<const std::string, N>& s1,
                    const std::span<const std::string, N>& s2) const noexcept {
      if constexpr (N > 0) {
        for (int i = 0; i < N; ++i) {
          if (s1[i] != s2[i]) {
            return false;
          }
        }
      }
      return true;
    }